

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

bool __thiscall
apngasm::APNGAsm::save(APNGAsm *this,string *outputPath,uchar coltype,uint first,uint loops)

{
  uint uVar1;
  uint uVar2;
  uchar f_00 [8];
  uchar *pimage1;
  uchar *ptemp;
  uchar *ptemp_00;
  uchar *ptemp_01;
  uchar *pimage1_00;
  uchar *rows_00;
  char *__filename;
  size_type sVar3;
  uchar *zbuf_00;
  uchar *puVar4;
  reference pvVar5;
  uchar uVar6;
  ulong uVar7;
  bool bVar8;
  uint local_150;
  uint local_14c;
  int op_best;
  uint op_min;
  size_t n;
  uint local_138;
  uchar dop;
  uint uStack_134;
  uchar bop;
  uint h0;
  uint w0;
  uint y0;
  uint x0;
  uchar buf_fcTL [26];
  uchar local_105 [4];
  undefined1 auStack_101 [4];
  uchar buf_acTL [8];
  uchar buf_IHDR [13];
  uchar *rows;
  uchar *prev;
  uchar *over3;
  uchar *over2;
  uchar *over1;
  uchar *temp;
  uchar auStack_b8 [4];
  uint bpp;
  uchar png_Software [27];
  undefined8 local_90;
  uchar png_sign [8];
  FILE *f;
  uchar *zbuf;
  uint local_70;
  uint zsize;
  uint zbuf_size;
  uint idat_size;
  uint imagesize;
  uint rowbytes;
  uint i;
  uint tcolor;
  uint has_tcolor;
  uint k;
  uint j;
  uint loops_local;
  uint first_local;
  uchar coltype_local;
  string *outputPath_local;
  APNGAsm *this_local;
  
  i = 0;
  rowbytes = 0;
  local_90 = 0xa1a0a0d474e5089;
  auStack_b8[0] = 'S';
  auStack_b8[1] = 'o';
  auStack_b8[2] = 'f';
  auStack_b8[3] = 't';
  bpp._0_1_ = 'w';
  bpp._1_1_ = 'a';
  bpp._2_1_ = 'r';
  bpp._3_1_ = 'e';
  png_Software[0] = '\0';
  png_Software[1] = 'A';
  png_Software[2] = 'P';
  png_Software[3] = 'N';
  png_Software[4] = 'G';
  png_Software[5] = ' ';
  png_Software[6] = 'A';
  png_Software[7] = 's';
  png_Software[8] = 's';
  png_Software[9] = 'e';
  png_Software[10] = 'm';
  png_Software[0xb] = 'b';
  png_Software[0xc] = 'l';
  png_Software[0xd] = 'e';
  png_Software[0xe] = 'r';
  png_Software[0xf] = ' ';
  png_Software[0x10] = '3';
  png_Software[0x11] = '.';
  png_Software[0x12] = '0';
  temp._4_4_ = 1;
  if (coltype == '\x02') {
    temp._4_4_ = 3;
  }
  else if (coltype == '\x04') {
    temp._4_4_ = 2;
  }
  else if (coltype == '\x06') {
    temp._4_4_ = 4;
  }
  if (coltype == '\0') {
    bVar8 = this->_trnssize != 0;
    if (bVar8) {
      rowbytes = (uint)this->_trns[1];
    }
    i = (uint)bVar8;
  }
  else if (coltype == '\x02') {
    bVar8 = this->_trnssize != 0;
    if (bVar8) {
      rowbytes = ((uint)this->_trns[5] * 0x100 + (uint)this->_trns[3]) * 0x100 +
                 (uint)this->_trns[1];
    }
    i = (uint)bVar8;
  }
  else if (coltype == '\x03') {
    for (imagesize = 0; imagesize < this->_trnssize; imagesize = imagesize + 1) {
      if (this->_trns[imagesize] == '\0') {
        i = 1;
        rowbytes = imagesize;
        break;
      }
    }
  }
  else {
    i = 1;
    rowbytes = 0;
  }
  idat_size = this->_width * temp._4_4_;
  zbuf_size = idat_size * this->_height;
  k = loops;
  j = first;
  loops_local._3_1_ = coltype;
  _first_local = outputPath;
  outputPath_local = (string *)this;
  pimage1 = (uchar *)operator_new__((ulong)zbuf_size);
  ptemp = (uchar *)operator_new__((ulong)zbuf_size);
  ptemp_00 = (uchar *)operator_new__((ulong)zbuf_size);
  ptemp_01 = (uchar *)operator_new__((ulong)zbuf_size);
  pimage1_00 = (uchar *)operator_new__((ulong)zbuf_size);
  rows_00 = (uchar *)operator_new__((ulong)((idat_size + 1) * this->_height));
  __filename = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(_first_local);
  png_sign = (uchar  [8])fopen(__filename,"wb");
  if (png_sign == (uchar  [8])0x0) {
    this_local._7_1_ = false;
  }
  else {
    png_save_uint_32(buf_acTL,this->_width);
    png_save_uint_32(buf_acTL + 4,this->_height);
    sVar3 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::size
                      (&this->_frames);
    png_save_uint_32(local_105,(int)sVar3 - j);
    png_save_uint_32(auStack_101,k);
    fwrite(&local_90,1,8,(FILE *)png_sign);
    write_chunk(this,(FILE *)png_sign,"IHDR",buf_acTL,0xd);
    sVar3 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::size
                      (&this->_frames);
    if (sVar3 < 2) {
      j = 0;
    }
    else {
      write_chunk(this,(FILE *)png_sign,"acTL",local_105,8);
    }
    if (this->_palsize != 0) {
      write_chunk(this,(FILE *)png_sign,"PLTE",&this->_palette[0].r,this->_palsize * 3);
    }
    if (this->_trnssize != 0) {
      write_chunk(this,(FILE *)png_sign,"tRNS",this->_trns,this->_trnssize);
    }
    (this->_op_zstream1).data_type = 0;
    (this->_op_zstream1).zalloc = (alloc_func)0x0;
    (this->_op_zstream1).zfree = (free_func)0x0;
    (this->_op_zstream1).opaque = (voidpf)0x0;
    deflateInit2_(&this->_op_zstream1,2,8,0xf,8,0,"1.2.11",0x70);
    (this->_op_zstream2).data_type = 0;
    (this->_op_zstream2).zalloc = (alloc_func)0x0;
    (this->_op_zstream2).zfree = (free_func)0x0;
    (this->_op_zstream2).opaque = (voidpf)0x0;
    deflateInit2_(&this->_op_zstream2,2,8,0xf,8,1,"1.2.11",0x70);
    zsize = (idat_size + 1) * this->_height;
    local_70 = zsize + (zsize + 7 >> 3) + (zsize + 0x3f >> 6) + 0xb;
    zbuf_00 = (uchar *)operator_new__((ulong)local_70);
    puVar4 = (uchar *)operator_new__((ulong)local_70);
    this->_op_zbuf1 = puVar4;
    puVar4 = (uchar *)operator_new__((ulong)local_70);
    this->_op_zbuf2 = puVar4;
    puVar4 = (uchar *)operator_new__((ulong)(idat_size + 1));
    this->_row_buf = puVar4;
    puVar4 = (uchar *)operator_new__((ulong)(idat_size + 1));
    this->_sub_row = puVar4;
    puVar4 = (uchar *)operator_new__((ulong)(idat_size + 1));
    this->_up_row = puVar4;
    puVar4 = (uchar *)operator_new__((ulong)(idat_size + 1));
    this->_avg_row = puVar4;
    puVar4 = (uchar *)operator_new__((ulong)(idat_size + 1));
    this->_paeth_row = puVar4;
    *this->_row_buf = '\0';
    *this->_sub_row = '\x01';
    *this->_up_row = '\x02';
    *this->_avg_row = '\x03';
    *this->_paeth_row = '\x04';
    w0 = 0;
    h0 = 0;
    uStack_134 = this->_width;
    local_138 = this->_height;
    n._7_1_ = 0;
    this->_next_seq_num = 0;
    for (has_tcolor = 0; has_tcolor < 6; has_tcolor = has_tcolor + 1) {
      this->_op[has_tcolor].valid = 0;
    }
    pvVar5 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                       (&this->_frames,0);
    deflate_rect_op(this,pvVar5->_pixels,0,0,uStack_134,local_138,temp._4_4_,idat_size,local_70,0);
    deflate_rect_fin(this,zbuf_00,(uint *)((long)&zbuf + 4),temp._4_4_,idat_size,rows_00,local_70,0)
    ;
    if (j != 0) {
      write_IDATs(this,(FILE *)png_sign,0,zbuf_00,zbuf._4_4_,zsize);
      for (has_tcolor = 0; has_tcolor < 6; has_tcolor = has_tcolor + 1) {
        this->_op[has_tcolor].valid = 0;
      }
      pvVar5 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                         (&this->_frames,1);
      deflate_rect_op(this,pvVar5->_pixels,0,0,uStack_134,local_138,temp._4_4_,idat_size,local_70,0)
      ;
      deflate_rect_fin(this,zbuf_00,(uint *)((long)&zbuf + 4),temp._4_4_,idat_size,rows_00,local_70,
                       0);
    }
    for (_op_best = (ulong)j;
        sVar3 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::size
                          (&this->_frames), _op_best < sVar3 - 1; _op_best = _op_best + 1) {
      for (has_tcolor = 0; has_tcolor < 6; has_tcolor = has_tcolor + 1) {
        this->_op[has_tcolor].valid = 0;
      }
      uVar1 = this->_width;
      uVar2 = this->_height;
      pvVar5 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                         (&this->_frames,_op_best);
      puVar4 = pvVar5->_pixels;
      pvVar5 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                         (&this->_frames,_op_best + 1);
      get_rect(this,uVar1,uVar2,puVar4,pvVar5->_pixels,ptemp,loops_local._3_1_,temp._4_4_,idat_size,
               local_70,i,rowbytes,0);
      if (i != 0) {
        pvVar5 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                           (&this->_frames,_op_best);
        memcpy(pimage1,pvVar5->_pixels,(ulong)zbuf_size);
        if (loops_local._3_1_ == '\x02') {
          for (has_tcolor = 0; has_tcolor < local_138; has_tcolor = has_tcolor + 1) {
            for (tcolor = 0; tcolor < uStack_134; tcolor = tcolor + 1) {
              uVar7 = (ulong)(((has_tcolor + h0) * this->_width + tcolor + w0) * 3);
              *(undefined2 *)(pimage1 + uVar7) = (undefined2)rowbytes;
              pimage1[uVar7 + 2] = rowbytes._2_1_;
            }
          }
        }
        else {
          for (has_tcolor = 0; has_tcolor < local_138; has_tcolor = has_tcolor + 1) {
            memset(pimage1 + ((has_tcolor + h0) * this->_width + w0) * temp._4_4_,rowbytes & 0xff,
                   (ulong)(uStack_134 * temp._4_4_));
          }
        }
        uVar1 = this->_width;
        uVar2 = this->_height;
        pvVar5 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                           (&this->_frames,_op_best + 1);
        get_rect(this,uVar1,uVar2,pimage1,pvVar5->_pixels,ptemp_00,loops_local._3_1_,temp._4_4_,
                 idat_size,local_70,i,rowbytes,1);
      }
      if (j < _op_best) {
        uVar1 = this->_width;
        uVar2 = this->_height;
        pvVar5 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                           (&this->_frames,_op_best + 1);
        get_rect(this,uVar1,uVar2,pimage1_00,pvVar5->_pixels,ptemp_01,loops_local._3_1_,temp._4_4_,
                 idat_size,local_70,i,rowbytes,2);
      }
      local_14c = this->_op[0].size;
      local_150 = 0;
      for (has_tcolor = 1; has_tcolor < 6; has_tcolor = has_tcolor + 1) {
        if ((this->_op[has_tcolor].valid != 0) && (this->_op[has_tcolor].size < local_14c)) {
          local_14c = this->_op[has_tcolor].size;
          local_150 = has_tcolor;
        }
      }
      uVar6 = (uchar)((int)local_150 >> 1);
      this->_next_seq_num = this->_next_seq_num + 1;
      png_save_uint_32(&y0);
      png_save_uint_32(&x0,uStack_134);
      png_save_uint_32(buf_fcTL,local_138);
      png_save_uint_32(buf_fcTL + 4,w0);
      png_save_uint_32(buf_fcTL + 8,h0);
      pvVar5 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                         (&this->_frames,_op_best);
      png_save_uint_16(buf_fcTL + 0xc,pvVar5->_delayNum);
      pvVar5 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                         (&this->_frames,_op_best);
      png_save_uint_16(buf_fcTL + 0xe,pvVar5->_delayDen);
      buf_fcTL[0x11] = n._7_1_;
      buf_fcTL[0x10] = uVar6;
      write_chunk(this,(FILE *)png_sign,"fcTL",(uchar *)&y0,0x1a);
      write_IDATs(this,(FILE *)png_sign,(int)_op_best,zbuf_00,zbuf._4_4_,zsize);
      if (uVar6 != '\x02') {
        pvVar5 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                           (&this->_frames,_op_best);
        memcpy(pimage1_00,pvVar5->_pixels,(ulong)zbuf_size);
      }
      if (uVar6 == '\x01') {
        if (loops_local._3_1_ == '\x02') {
          for (has_tcolor = 0; has_tcolor < local_138; has_tcolor = has_tcolor + 1) {
            for (tcolor = 0; tcolor < uStack_134; tcolor = tcolor + 1) {
              uVar7 = (ulong)(((has_tcolor + h0) * this->_width + tcolor + w0) * 3);
              *(undefined2 *)(pimage1_00 + uVar7) = (undefined2)rowbytes;
              pimage1_00[uVar7 + 2] = rowbytes._2_1_;
            }
          }
        }
        else {
          for (has_tcolor = 0; has_tcolor < local_138; has_tcolor = has_tcolor + 1) {
            memset(pimage1_00 + ((has_tcolor + h0) * this->_width + w0) * temp._4_4_,rowbytes & 0xff
                   ,(ulong)(uStack_134 * temp._4_4_));
          }
        }
      }
      w0 = this->_op[(int)local_150].x;
      h0 = this->_op[(int)local_150].y;
      uStack_134 = this->_op[(int)local_150].w;
      local_138 = this->_op[(int)local_150].h;
      n._7_1_ = (byte)local_150 & 1;
      deflate_rect_fin(this,zbuf_00,(uint *)((long)&zbuf + 4),temp._4_4_,idat_size,rows_00,local_70,
                       local_150);
    }
    sVar3 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::size
                      (&this->_frames);
    if (1 < sVar3) {
      this->_next_seq_num = this->_next_seq_num + 1;
      png_save_uint_32(&y0);
      png_save_uint_32(&x0,uStack_134);
      png_save_uint_32(buf_fcTL,local_138);
      png_save_uint_32(buf_fcTL + 4,w0);
      png_save_uint_32(buf_fcTL + 8,h0);
      sVar3 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::size
                        (&this->_frames);
      pvVar5 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                         (&this->_frames,sVar3 - 1);
      png_save_uint_16(buf_fcTL + 0xc,pvVar5->_delayNum);
      sVar3 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::size
                        (&this->_frames);
      pvVar5 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                         (&this->_frames,sVar3 - 1);
      png_save_uint_16(buf_fcTL + 0xe,pvVar5->_delayDen);
      buf_fcTL[0x10] = '\0';
      buf_fcTL[0x11] = n._7_1_;
      write_chunk(this,(FILE *)png_sign,"fcTL",(uchar *)&y0,0x1a);
    }
    f_00 = png_sign;
    sVar3 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::size
                      (&this->_frames);
    write_IDATs(this,(FILE *)f_00,(int)sVar3 + -1,zbuf_00,zbuf._4_4_,zsize);
    write_chunk(this,(FILE *)png_sign,"tEXt",auStack_b8,0x1b);
    write_chunk(this,(FILE *)png_sign,"IEND",(uchar *)0x0,0);
    fclose((FILE *)png_sign);
    if (zbuf_00 != (uchar *)0x0) {
      operator_delete__(zbuf_00);
    }
    if (this->_op_zbuf1 != (uchar *)0x0) {
      operator_delete__(this->_op_zbuf1);
    }
    if (this->_op_zbuf2 != (uchar *)0x0) {
      operator_delete__(this->_op_zbuf2);
    }
    if (this->_row_buf != (uchar *)0x0) {
      operator_delete__(this->_row_buf);
    }
    if (this->_sub_row != (uchar *)0x0) {
      operator_delete__(this->_sub_row);
    }
    if (this->_up_row != (uchar *)0x0) {
      operator_delete__(this->_up_row);
    }
    if (this->_avg_row != (uchar *)0x0) {
      operator_delete__(this->_avg_row);
    }
    if (this->_paeth_row != (uchar *)0x0) {
      operator_delete__(this->_paeth_row);
    }
    deflateEnd(&this->_op_zstream1);
    deflateEnd(&this->_op_zstream2);
    if (pimage1 != (uchar *)0x0) {
      operator_delete__(pimage1);
    }
    if (ptemp != (uchar *)0x0) {
      operator_delete__(ptemp);
    }
    if (ptemp_00 != (uchar *)0x0) {
      operator_delete__(ptemp_00);
    }
    if (ptemp_01 != (uchar *)0x0) {
      operator_delete__(ptemp_01);
    }
    if (pimage1_00 != (uchar *)0x0) {
      operator_delete__(pimage1_00);
    }
    if (rows_00 != (uchar *)0x0) {
      operator_delete__(rows_00);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool APNGAsm::save(const std::string &outputPath, unsigned char coltype, unsigned int first, unsigned int loops)
  {
    unsigned int    j, k;
    unsigned int    has_tcolor = 0;
    unsigned int    tcolor = 0;
    unsigned int    i, rowbytes, imagesize;
    unsigned int    idat_size, zbuf_size, zsize;
    unsigned char * zbuf;
    FILE*           f;
    unsigned char   png_sign[8] = {137,  80,  78,  71,  13,  10,  26,  10};
    unsigned char   png_Software[27] = { 83, 111, 102, 116, 119, 97, 114, 101, '\0',
                                         65,  80,  78,  71,  32, 65, 115, 115, 101,
                                        109,  98, 108, 101, 114, 32,  51,  46,  48};

    unsigned int bpp = 1;
    if (coltype == 2)
      bpp = 3;
    else
    if (coltype == 4)
      bpp = 2;
    else
    if (coltype == 6)
      bpp = 4;

    if (coltype == 0)
    {
      if (_trnssize)
      {
        has_tcolor = 1;
        tcolor = _trns[1];
      }
    }
    else
    if (coltype == 2)
    {
      if (_trnssize)
      {
        has_tcolor = 1;
        tcolor = (((_trns[5]<<8)+_trns[3])<<8)+_trns[1];
      }
    }
    else
    if (coltype == 3)
    {
      for (i=0; i<_trnssize; i++)
      if (_trns[i] == 0)
      {
        has_tcolor = 1;
        tcolor = i;
        break;
      }
    }
    else
    {
      has_tcolor = 1;
      tcolor = 0;
    }

    rowbytes  = _width * bpp;
    imagesize = rowbytes * _height;

    unsigned char * temp  = new unsigned char[imagesize];
    unsigned char * over1 = new unsigned char[imagesize];
    unsigned char * over2 = new unsigned char[imagesize];
    unsigned char * over3 = new unsigned char[imagesize];
    unsigned char * prev  = new unsigned char[imagesize];
    unsigned char * rows  = new unsigned char[(rowbytes + 1) * _height];

    if ((f = fopen(outputPath.c_str(), "wb")) != 0)
    {
      unsigned char buf_IHDR[13];
      unsigned char buf_acTL[8];
      unsigned char buf_fcTL[26];

      png_save_uint_32(buf_IHDR, _width);
      png_save_uint_32(buf_IHDR + 4, _height);
      buf_IHDR[8] = 8;
      buf_IHDR[9] = coltype;
      buf_IHDR[10] = 0;
      buf_IHDR[11] = 0;
      buf_IHDR[12] = 0;

      png_save_uint_32(buf_acTL, _frames.size() - first);
      png_save_uint_32(buf_acTL + 4, loops);

      fwrite(png_sign, 1, 8, f);

      write_chunk(f, "IHDR", buf_IHDR, 13);

      if (_frames.size() > 1)
        write_chunk(f, "acTL", buf_acTL, 8);
      else
        first = 0;

      if (_palsize > 0)
        write_chunk(f, "PLTE", (unsigned char *)(&_palette), _palsize*3);

      if (_trnssize > 0)
        write_chunk(f, "tRNS", _trns, _trnssize);

      _op_zstream1.data_type = Z_BINARY;
      _op_zstream1.zalloc = Z_NULL;
      _op_zstream1.zfree = Z_NULL;
      _op_zstream1.opaque = Z_NULL;
      deflateInit2(&_op_zstream1, Z_BEST_SPEED+1, 8, 15, 8, Z_DEFAULT_STRATEGY);

      _op_zstream2.data_type = Z_BINARY;
      _op_zstream2.zalloc = Z_NULL;
      _op_zstream2.zfree = Z_NULL;
      _op_zstream2.opaque = Z_NULL;
      deflateInit2(&_op_zstream2, Z_BEST_SPEED+1, 8, 15, 8, Z_FILTERED);

      idat_size = (rowbytes + 1) * _height;
      zbuf_size = idat_size + ((idat_size + 7) >> 3) + ((idat_size + 63) >> 6) + 11;

      zbuf = new unsigned char[zbuf_size];
      _op_zbuf1 = new unsigned char[zbuf_size];
      _op_zbuf2 = new unsigned char[zbuf_size];
      _row_buf = new unsigned char[rowbytes + 1];
      _sub_row = new unsigned char[rowbytes + 1];
      _up_row = new unsigned char[rowbytes + 1];
      _avg_row = new unsigned char[rowbytes + 1];
      _paeth_row = new unsigned char[rowbytes + 1];

      _row_buf[0] = 0;
      _sub_row[0] = 1;
      _up_row[0] = 2;
      _avg_row[0] = 3;
      _paeth_row[0] = 4;

      unsigned int x0 = 0;
      unsigned int y0 = 0;
      unsigned int w0 = _width;
      unsigned int h0 = _height;
      unsigned char bop = 0;
      unsigned char dop = 0;
      _next_seq_num = 0;

      for (j=0; j<6; j++)
        _op[j].valid = 0;
      deflate_rect_op(_frames[0]._pixels, x0, y0, w0, h0, bpp, rowbytes, zbuf_size, 0);
      deflate_rect_fin(zbuf, &zsize, bpp, rowbytes, rows, zbuf_size, 0);

      if (first)
      {
        write_IDATs(f, 0, zbuf, zsize, idat_size);

        for (j=0; j<6; j++)
          _op[j].valid = 0;
        deflate_rect_op(_frames[1]._pixels, x0, y0, w0, h0, bpp, rowbytes, zbuf_size, 0);
        deflate_rect_fin(zbuf, &zsize, bpp, rowbytes, rows, zbuf_size, 0);
      }

      for (size_t n = first; n < _frames.size()-1; ++n)
      {
        unsigned int op_min;
        int          op_best;

        for (j=0; j<6; j++)
          _op[j].valid = 0;

        /* dispose = none */
        get_rect(_width, _height, _frames[n]._pixels, _frames[n+1]._pixels, over1, coltype, bpp, rowbytes, zbuf_size, has_tcolor, tcolor, 0);

        /* dispose = background */
        if (has_tcolor)
        {
          memcpy(temp, _frames[n]._pixels, imagesize);
          if (coltype == 2)
            for (j=0; j<h0; j++)
              for (k=0; k<w0; k++)
                memcpy(temp + ((j+y0)*_width + (k+x0))*3, &tcolor, 3);
          else
            for (j=0; j<h0; j++)
              memset(temp + ((j+y0)*_width + x0)*bpp, tcolor, w0*bpp);

          get_rect(_width, _height, temp, _frames[n+1]._pixels, over2, coltype, bpp, rowbytes, zbuf_size, has_tcolor, tcolor, 1);
        }

        /* dispose = previous */
        if (n > first)
          get_rect(_width, _height, prev, _frames[n+1]._pixels, over3, coltype, bpp, rowbytes, zbuf_size, has_tcolor, tcolor, 2);

        op_min = _op[0].size;
        op_best = 0;
        for (j=1; j<6; j++)
        if (_op[j].valid)
        {
          if (_op[j].size < op_min)
          {
            op_min = _op[j].size;
            op_best = j;
          }
        }

        dop = op_best >> 1;

        png_save_uint_32(buf_fcTL, _next_seq_num++);
        png_save_uint_32(buf_fcTL + 4, w0);
        png_save_uint_32(buf_fcTL + 8, h0);
        png_save_uint_32(buf_fcTL + 12, x0);
        png_save_uint_32(buf_fcTL + 16, y0);
        png_save_uint_16(buf_fcTL + 20, _frames[n]._delayNum);
        png_save_uint_16(buf_fcTL + 22, _frames[n]._delayDen);
        buf_fcTL[24] = dop;
        buf_fcTL[25] = bop;
        write_chunk(f, "fcTL", buf_fcTL, 26);

        write_IDATs(f, n, zbuf, zsize, idat_size);

        /* process apng dispose - begin */
        if (dop != 2)
          memcpy(prev, _frames[n]._pixels, imagesize);

        if (dop == 1)
        {
          if (coltype == 2)
            for (j=0; j<h0; j++)
              for (k=0; k<w0; k++)
                memcpy(prev + ((j+y0)*_width + (k+x0))*3, &tcolor, 3);
          else
            for (j=0; j<h0; j++)
              memset(prev + ((j+y0)*_width + x0)*bpp, tcolor, w0*bpp);
        }
        /* process apng dispose - end */

        x0 = _op[op_best].x;
        y0 = _op[op_best].y;
        w0 = _op[op_best].w;
        h0 = _op[op_best].h;
        bop = op_best & 1;

        deflate_rect_fin(zbuf, &zsize, bpp, rowbytes, rows, zbuf_size, op_best);
      }

      if (_frames.size() > 1)
      {
        png_save_uint_32(buf_fcTL, _next_seq_num++);
        png_save_uint_32(buf_fcTL + 4, w0);
        png_save_uint_32(buf_fcTL + 8, h0);
        png_save_uint_32(buf_fcTL + 12, x0);
        png_save_uint_32(buf_fcTL + 16, y0);
        png_save_uint_16(buf_fcTL + 20, _frames[_frames.size()-1]._delayNum);
        png_save_uint_16(buf_fcTL + 22, _frames[_frames.size()-1]._delayDen);
        buf_fcTL[24] = 0;
        buf_fcTL[25] = bop;
        write_chunk(f, "fcTL", buf_fcTL, 26);
      }

      write_IDATs(f, _frames.size()-1, zbuf, zsize, idat_size);

      write_chunk(f, "tEXt", png_Software, 27);
      write_chunk(f, "IEND", 0, 0);
      fclose(f);

      delete[] zbuf;
      delete[] _op_zbuf1;
      delete[] _op_zbuf2;
      delete[] _row_buf;
      delete[] _sub_row;
      delete[] _up_row;
      delete[] _avg_row;
      delete[] _paeth_row;

      deflateEnd(&_op_zstream1);
      deflateEnd(&_op_zstream2);
    }
    else
      return false;

    delete[] temp;
    delete[] over1;
    delete[] over2;
    delete[] over3;
    delete[] prev;
    delete[] rows;

    return true;
  }